

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionComplete.c
# Opt level: O1

int UpnpActionComplete_assign(UpnpActionComplete *p,UpnpActionComplete *q)

{
  int iVar1;
  char *s;
  uint uVar2;
  
  if (p == q) {
    uVar2 = 1;
  }
  else {
    p->m_ErrCode = q->m_ErrCode;
    s = UpnpString_get_String(q->m_CtrlUrl);
    iVar1 = UpnpString_set_String(p->m_CtrlUrl,s);
    if (iVar1 != 0) {
      p->m_ActionRequest = q->m_ActionRequest;
      p->m_ActionResult = q->m_ActionResult;
    }
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int UpnpActionComplete_assign(
	UpnpActionComplete *p, const UpnpActionComplete *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionComplete_set_ErrCode(
				   p, UpnpActionComplete_get_ErrCode(q));
		ok = ok && UpnpActionComplete_set_CtrlUrl(
				   p, UpnpActionComplete_get_CtrlUrl(q));
		ok = ok && UpnpActionComplete_set_ActionRequest(
				   p, UpnpActionComplete_get_ActionRequest(q));
		ok = ok && UpnpActionComplete_set_ActionResult(
				   p, UpnpActionComplete_get_ActionResult(q));
	}

	return ok;
}